

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testsc.c
# Opt level: O2

void test_mp_nthroot(void)

{
  ulong in_RAX;
  mp_int *x;
  mp_int *x_00;
  size_t sVar1;
  mp_int *x_01;
  size_t i;
  ulong uVar2;
  ulong uStack_38;
  uint8_t sizes [1];
  
  uStack_38 = in_RAX;
  x = mp_new(0x100);
  x_00 = mp_new(0x100);
  uVar2 = 0;
  while( true ) {
    sVar1 = (*looplimit)(0x20);
    if (sVar1 <= uVar2) break;
    random_read(sizes,1);
    mp_random_bits_into(x,uStack_38 >> 0x38);
    log_start();
    x_01 = mp_nthroot(x,3,x_00);
    mp_free(x_01);
    log_end();
    uVar2 = uVar2 + 1;
  }
  mp_free(x);
  mp_free(x_00);
  return;
}

Assistant:

static void test_mp_nthroot(void)
{
    mp_int *x = mp_new(256), *remainder = mp_new(256);

    for (size_t i = 0; i < looplimit(32); i++) {
        uint8_t sizes[1];
        random_read(sizes, 1);
        mp_random_bits_into(x, sizes[0]);
        log_start();
        mp_free(mp_nthroot(x, 3, remainder));
        log_end();
    }

    mp_free(x);
    mp_free(remainder);
}